

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

int If_CutPerformCheck45(If_Man_t *p,uint *pTruth,int nVars,int nLeaves,char *pStr)

{
  undefined8 uVar1;
  int iVar2;
  If_Grp_t local_7a;
  word local_68;
  word Func1;
  word Func0;
  If_Grp_t R;
  If_Grp_t G;
  char *pStr_local;
  int nLeaves_local;
  int nVars_local;
  uint *pTruth_local;
  If_Man_t *p_local;
  
  If_CluCheck(&local_7a,p,(word *)pTruth,nLeaves,0,0,5,4,(If_Grp_t *)((long)&Func0 + 4),&Func1,
              &local_68,(word *)0x0,0);
  R.pVars[8] = local_7a.nVars;
  R.pVars[9] = local_7a.nMyu;
  R.pVars[10] = local_7a.pVars[0];
  R.pVars[0xb] = local_7a.pVars[1];
  R.pVars[0xc] = local_7a.pVars[2];
  R.pVars[0xd] = local_7a.pVars[3];
  R.pVars[0xe] = local_7a.pVars[4];
  R.pVars[0xf] = local_7a.pVars[5];
  uVar1 = R.pVars._8_8_;
  R.pVars[8] = local_7a.nVars;
  if (R.pVars[8] != '\0') {
    R.pVars._8_8_ = uVar1;
    Func1 = If_CluAdjust(Func1,(int)Func0._4_1_);
    local_68 = If_CluAdjust(local_68,(int)R.pVars[8]);
    if (((R.pVars[8] < '\x05') ||
        ((p->pPars->fEnableCheck75 != 0 && (iVar2 = If_CluCheckDecOut(local_68,5), iVar2 != 0)))) ||
       ((p->pPars->fEnableCheck75u != 0 && (iVar2 = If_CluCheckDecOutU(local_68,5), iVar2 != 0)))) {
      p_local._4_4_ = 1;
    }
    else {
      p_local._4_4_ = 0;
    }
    return p_local._4_4_;
  }
  return 0;
}

Assistant:

int If_CutPerformCheck45( If_Man_t * p, unsigned * pTruth, int nVars, int nLeaves, char * pStr )
{    
    // 5LUT -> 4LUT
    If_Grp_t G, R;
    word Func0, Func1;
    G = If_CluCheck( p, (word *)pTruth, nLeaves, 0, 0, 5, 4, &R, &Func0, &Func1, NULL, 0 );
    if ( G.nVars == 0 )
        return 0;
    Func0 = If_CluAdjust( Func0, R.nVars );
    Func1 = If_CluAdjust( Func1, G.nVars );
#if 0
    Kit_DsdPrintFromTruth( pTruth, nVars ); printf( "\n" );
    Kit_DsdPrintFromTruth( (unsigned*)&Func0, R.nVars ); printf( "\n" );
    Kit_DsdPrintFromTruth( (unsigned*)&Func1, G.nVars ); printf( "\n" );
    If_CluPrintGroup( &R );
    If_CluPrintGroup( &G );
#endif
    if ( G.nVars < 5 || (p->pPars->fEnableCheck75 && If_CluCheckDecOut(Func1, 5)) || (p->pPars->fEnableCheck75u && If_CluCheckDecOutU(Func1, 5)) )
        return 1;
    return 0;
}